

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O1

unsigned_long
duckdb::MultiplyOperatorOverflowCheck::Operation<unsigned_long,unsigned_long,unsigned_long>
          (unsigned_long left,unsigned_long right)

{
  bool bVar1;
  unsigned_long uVar2;
  OutOfRangeException *this;
  ulong uVar3;
  PhysicalType type;
  unsigned_long uVar4;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  uVar4 = right;
  if (right < left) {
    uVar4 = left;
  }
  uVar2 = right;
  if (left < right) {
    uVar2 = left;
  }
  if (uVar2 >> 0x20 == 0) {
    uVar3 = (uVar4 >> 0x20) * uVar2;
    if (uVar3 >> 0x20 == 0) {
      bVar1 = uVar3 << 0x20 <= ~((uVar4 & 0xffffffff) * uVar2);
      uVar2 = right * left;
      goto LAB_010dae7b;
    }
  }
  bVar1 = false;
LAB_010dae7b:
  if (bVar1) {
    return uVar2;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Overflow in multiplication of %s (%s * %s)!","");
  TypeIdToString_abi_cxx11_(&local_48,(duckdb *)0x8,type);
  NumericHelper::ToString<unsigned_long>(&local_68,left);
  NumericHelper::ToString<unsigned_long>(&local_88,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
             &local_68,&local_88);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryMultiplyOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of %s (%s * %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}